

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

LinearKernel * __thiscall CoreML::Specification::Kernel::mutable_linearkernel(Kernel *this)

{
  bool bVar1;
  LinearKernel *this_00;
  Kernel *this_local;
  
  bVar1 = has_linearkernel(this);
  if (!bVar1) {
    clear_kernel(this);
    set_has_linearkernel(this);
    this_00 = (LinearKernel *)operator_new(0x18);
    LinearKernel::LinearKernel(this_00);
    (this->kernel_).linearkernel_ = this_00;
  }
  return (this->kernel_).linearkernel_;
}

Assistant:

inline ::CoreML::Specification::LinearKernel* Kernel::mutable_linearkernel() {
  if (!has_linearkernel()) {
    clear_kernel();
    set_has_linearkernel();
    kernel_.linearkernel_ = new ::CoreML::Specification::LinearKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.linearKernel)
  return kernel_.linearkernel_;
}